

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Model::Model(Model *this,Model *from)

{
  bool bVar1;
  TypeCase TVar2;
  InternalMetadataWithArenaLite *this_00;
  ModelDescription *this_01;
  PipelineClassifier *this_02;
  PipelineClassifier *from_00;
  PipelineRegressor *this_03;
  PipelineRegressor *from_01;
  Pipeline *this_04;
  Pipeline *from_02;
  GLMRegressor *this_05;
  GLMRegressor *from_03;
  SupportVectorRegressor *this_06;
  SupportVectorRegressor *from_04;
  TreeEnsembleRegressor *this_07;
  TreeEnsembleRegressor *from_05;
  NeuralNetworkRegressor *this_08;
  NeuralNetworkRegressor *from_06;
  BayesianProbitRegressor *this_09;
  BayesianProbitRegressor *from_07;
  GLMClassifier *this_10;
  GLMClassifier *from_08;
  SupportVectorClassifier *this_11;
  SupportVectorClassifier *from_09;
  TreeEnsembleClassifier *this_12;
  TreeEnsembleClassifier *from_10;
  NeuralNetworkClassifier *this_13;
  NeuralNetworkClassifier *from_11;
  KNearestNeighborsClassifier *this_14;
  KNearestNeighborsClassifier *from_12;
  NeuralNetwork *this_15;
  NeuralNetwork *from_13;
  ItemSimilarityRecommender *this_16;
  ItemSimilarityRecommender *from_14;
  Program *this_17;
  Program *from_15;
  CustomModel *this_18;
  CustomModel *from_16;
  LinkedModel *this_19;
  LinkedModel *from_17;
  OneHotEncoder *this_20;
  OneHotEncoder *from_18;
  Imputer *this_21;
  Imputer *from_19;
  FeatureVectorizer *this_22;
  FeatureVectorizer *from_20;
  DictVectorizer *this_23;
  DictVectorizer *from_21;
  Scaler *this_24;
  Scaler *from_22;
  CategoricalMapping *this_25;
  CategoricalMapping *from_23;
  Normalizer *this_26;
  Normalizer *from_24;
  ArrayFeatureExtractor *this_27;
  ArrayFeatureExtractor *from_25;
  NonMaximumSuppression *this_28;
  NonMaximumSuppression *from_26;
  Identity *this_29;
  Identity *from_27;
  TextClassifier *this_30;
  TextClassifier *from_28;
  WordTagger *this_31;
  WordTagger *from_29;
  VisionFeaturePrint *this_32;
  VisionFeaturePrint *from_30;
  SoundAnalysisPreprocessing *this_33;
  SoundAnalysisPreprocessing *from_31;
  Gazetteer *this_34;
  Gazetteer *from_32;
  WordEmbedding *this_35;
  WordEmbedding *from_33;
  AudioFeaturePrint *this_36;
  AudioFeaturePrint *from_34;
  SerializedModel *this_37;
  SerializedModel *from_35;
  Model *from_local;
  Model *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Model_006254c0;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  TypeUnion::TypeUnion((TypeUnion *)&this->Type_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_description(from);
  if (bVar1) {
    this_01 = (ModelDescription *)operator_new(0x78);
    ModelDescription::ModelDescription(this_01,from->description_);
    this->description_ = this_01;
  }
  else {
    this->description_ = (ModelDescription *)0x0;
  }
  memcpy(&this->specificationversion_,&from->specificationversion_,
         (long)this + (0x1d - (long)&this->specificationversion_));
  clear_has_Type(this);
  TVar2 = Type_case(from);
  if (TVar2 != TYPE_NOT_SET) {
    if (TVar2 == kPipelineClassifier) {
      this_02 = mutable_pipelineclassifier(this);
      from_00 = pipelineclassifier(from);
      PipelineClassifier::MergeFrom(this_02,from_00);
    }
    else if (TVar2 == kPipelineRegressor) {
      this_03 = mutable_pipelineregressor(this);
      from_01 = pipelineregressor(from);
      PipelineRegressor::MergeFrom(this_03,from_01);
    }
    else if (TVar2 == kPipeline) {
      this_04 = mutable_pipeline(this);
      from_02 = pipeline(from);
      Pipeline::MergeFrom(this_04,from_02);
    }
    else if (TVar2 == kGlmRegressor) {
      this_05 = mutable_glmregressor(this);
      from_03 = glmregressor(from);
      GLMRegressor::MergeFrom(this_05,from_03);
    }
    else if (TVar2 == kSupportVectorRegressor) {
      this_06 = mutable_supportvectorregressor(this);
      from_04 = supportvectorregressor(from);
      SupportVectorRegressor::MergeFrom(this_06,from_04);
    }
    else if (TVar2 == kTreeEnsembleRegressor) {
      this_07 = mutable_treeensembleregressor(this);
      from_05 = treeensembleregressor(from);
      TreeEnsembleRegressor::MergeFrom(this_07,from_05);
    }
    else if (TVar2 == kNeuralNetworkRegressor) {
      this_08 = mutable_neuralnetworkregressor(this);
      from_06 = neuralnetworkregressor(from);
      NeuralNetworkRegressor::MergeFrom(this_08,from_06);
    }
    else if (TVar2 == kBayesianProbitRegressor) {
      this_09 = mutable_bayesianprobitregressor(this);
      from_07 = bayesianprobitregressor(from);
      BayesianProbitRegressor::MergeFrom(this_09,from_07);
    }
    else if (TVar2 == kGlmClassifier) {
      this_10 = mutable_glmclassifier(this);
      from_08 = glmclassifier(from);
      GLMClassifier::MergeFrom(this_10,from_08);
    }
    else if (TVar2 == kSupportVectorClassifier) {
      this_11 = mutable_supportvectorclassifier(this);
      from_09 = supportvectorclassifier(from);
      SupportVectorClassifier::MergeFrom(this_11,from_09);
    }
    else if (TVar2 == kTreeEnsembleClassifier) {
      this_12 = mutable_treeensembleclassifier(this);
      from_10 = treeensembleclassifier(from);
      TreeEnsembleClassifier::MergeFrom(this_12,from_10);
    }
    else if (TVar2 == kNeuralNetworkClassifier) {
      this_13 = mutable_neuralnetworkclassifier(this);
      from_11 = neuralnetworkclassifier(from);
      NeuralNetworkClassifier::MergeFrom(this_13,from_11);
    }
    else if (TVar2 == kKNearestNeighborsClassifier) {
      this_14 = mutable_knearestneighborsclassifier(this);
      from_12 = knearestneighborsclassifier(from);
      KNearestNeighborsClassifier::MergeFrom(this_14,from_12);
    }
    else if (TVar2 == kNeuralNetwork) {
      this_15 = mutable_neuralnetwork(this);
      from_13 = neuralnetwork(from);
      NeuralNetwork::MergeFrom(this_15,from_13);
    }
    else if (TVar2 == kItemSimilarityRecommender) {
      this_16 = mutable_itemsimilarityrecommender(this);
      from_14 = itemsimilarityrecommender(from);
      ItemSimilarityRecommender::MergeFrom(this_16,from_14);
    }
    else if (TVar2 == kMlProgram) {
      this_17 = mutable_mlprogram(this);
      from_15 = mlprogram(from);
      MILSpec::Program::MergeFrom(this_17,from_15);
    }
    else if (TVar2 == kCustomModel) {
      this_18 = mutable_custommodel(this);
      from_16 = custommodel(from);
      CustomModel::MergeFrom(this_18,from_16);
    }
    else if (TVar2 == kLinkedModel) {
      this_19 = mutable_linkedmodel(this);
      from_17 = linkedmodel(from);
      LinkedModel::MergeFrom(this_19,from_17);
    }
    else if (TVar2 == kOneHotEncoder) {
      this_20 = mutable_onehotencoder(this);
      from_18 = onehotencoder(from);
      OneHotEncoder::MergeFrom(this_20,from_18);
    }
    else if (TVar2 == kImputer) {
      this_21 = mutable_imputer(this);
      from_19 = imputer(from);
      Imputer::MergeFrom(this_21,from_19);
    }
    else if (TVar2 == kFeatureVectorizer) {
      this_22 = mutable_featurevectorizer(this);
      from_20 = featurevectorizer(from);
      FeatureVectorizer::MergeFrom(this_22,from_20);
    }
    else if (TVar2 == kDictVectorizer) {
      this_23 = mutable_dictvectorizer(this);
      from_21 = dictvectorizer(from);
      DictVectorizer::MergeFrom(this_23,from_21);
    }
    else if (TVar2 == kScaler) {
      this_24 = mutable_scaler(this);
      from_22 = scaler(from);
      Scaler::MergeFrom(this_24,from_22);
    }
    else if (TVar2 == kCategoricalMapping) {
      this_25 = mutable_categoricalmapping(this);
      from_23 = categoricalmapping(from);
      CategoricalMapping::MergeFrom(this_25,from_23);
    }
    else if (TVar2 == kNormalizer) {
      this_26 = mutable_normalizer(this);
      from_24 = normalizer(from);
      Normalizer::MergeFrom(this_26,from_24);
    }
    else if (TVar2 == kArrayFeatureExtractor) {
      this_27 = mutable_arrayfeatureextractor(this);
      from_25 = arrayfeatureextractor(from);
      ArrayFeatureExtractor::MergeFrom(this_27,from_25);
    }
    else if (TVar2 == kNonMaximumSuppression) {
      this_28 = mutable_nonmaximumsuppression(this);
      from_26 = nonmaximumsuppression(from);
      NonMaximumSuppression::MergeFrom(this_28,from_26);
    }
    else if (TVar2 == kIdentity) {
      this_29 = mutable_identity(this);
      from_27 = identity(from);
      Identity::MergeFrom(this_29,from_27);
    }
    else if (TVar2 == kTextClassifier) {
      this_30 = mutable_textclassifier(this);
      from_28 = textclassifier(from);
      CoreMLModels::TextClassifier::MergeFrom(this_30,from_28);
    }
    else if (TVar2 == kWordTagger) {
      this_31 = mutable_wordtagger(this);
      from_29 = wordtagger(from);
      CoreMLModels::WordTagger::MergeFrom(this_31,from_29);
    }
    else if (TVar2 == kVisionFeaturePrint) {
      this_32 = mutable_visionfeatureprint(this);
      from_30 = visionfeatureprint(from);
      CoreMLModels::VisionFeaturePrint::MergeFrom(this_32,from_30);
    }
    else if (TVar2 == kSoundAnalysisPreprocessing) {
      this_33 = mutable_soundanalysispreprocessing(this);
      from_31 = soundanalysispreprocessing(from);
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(this_33,from_31);
    }
    else if (TVar2 == kGazetteer) {
      this_34 = mutable_gazetteer(this);
      from_32 = gazetteer(from);
      CoreMLModels::Gazetteer::MergeFrom(this_34,from_32);
    }
    else if (TVar2 == kWordEmbedding) {
      this_35 = mutable_wordembedding(this);
      from_33 = wordembedding(from);
      CoreMLModels::WordEmbedding::MergeFrom(this_35,from_33);
    }
    else if (TVar2 == kAudioFeaturePrint) {
      this_36 = mutable_audiofeatureprint(this);
      from_34 = audiofeatureprint(from);
      CoreMLModels::AudioFeaturePrint::MergeFrom(this_36,from_34);
    }
    else if (TVar2 == kSerializedModel) {
      this_37 = mutable_serializedmodel(this);
      from_35 = serializedmodel(from);
      SerializedModel::MergeFrom(this_37,from_35);
    }
  }
  return;
}

Assistant:

Model::Model(const Model& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_description()) {
    description_ = new ::CoreML::Specification::ModelDescription(*from.description_);
  } else {
    description_ = NULL;
  }
  ::memcpy(&specificationversion_, &from.specificationversion_,
    reinterpret_cast<char*>(&isupdatable_) -
    reinterpret_cast<char*>(&specificationversion_) + sizeof(isupdatable_));
  clear_has_Type();
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kMlProgram: {
      mutable_mlprogram()->::CoreML::Specification::MILSpec::Program::MergeFrom(from.mlprogram());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kAudioFeaturePrint: {
      mutable_audiofeatureprint()->::CoreML::Specification::CoreMLModels::AudioFeaturePrint::MergeFrom(from.audiofeatureprint());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Model)
}